

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-01.cpp
# Opt level: O2

int __thiscall
baryonyx::itm::
solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
::compute_reduced_costs<baryonyx::bit_array>
          (solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>
           *this,row_iterator begin,row_iterator end,bit_array *x)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  tuple<baryonyx::sparse_matrix<int>::col_value_*,_baryonyx::sparse_matrix<int>::col_value_*> ht;
  __uniq_ptr_impl<int,_std::default_delete<int[]>_> local_40;
  _Head_base<0UL,_int_*,_false> local_38;
  
  lVar1 = 0;
  for (; begin != end; begin = begin + 1) {
    sparse_matrix<int>::column((sparse_matrix<int> *)&local_40,(int)this + 0x10);
    dVar2 = 0.0;
    dVar4 = 0.0;
    for (; (tuple<int_*,_std::default_delete<int[]>_>)local_38._M_head_impl !=
           (_Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>)
           local_40._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
        local_38._M_head_impl = local_38._M_head_impl + 2) {
      dVar2 = dVar2 + (this->pi)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                      super__Head_base<0UL,_double_*,_false>._M_head_impl[local_38._M_head_impl[1]];
      dVar4 = dVar4 + (this->P)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                      super__Head_base<0UL,_double_*,_false>._M_head_impl[*local_38._M_head_impl];
    }
    (this->R)._M_t.
    super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
    .
    super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
    ._M_head_impl[lVar1].id = (int)lVar1;
    dVar3 = quadratic_cost_type<double>::operator()(this->c,begin->column,x);
    (this->R)._M_t.
    super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data[]>_>
    .
    super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<double>,_true>::rc_data_*,_false>
    ._M_head_impl[lVar1].value = (dVar3 - dVar2) - dVar4;
    lVar1 = lVar1 + 1;
  }
  return (int)lVar1;
}

Assistant:

int compute_reduced_costs(sparse_matrix<int>::row_iterator begin,
                              sparse_matrix<int>::row_iterator end,
                              const Xtype& x) noexcept
    {
        int r_size = 0;

        for (; begin != end; ++begin) {
            Float sum_a_pi = 0;
            Float sum_a_p = 0;

            auto ht = ap.column(begin->column);

            for (; std::get<0>(ht) != std::get<1>(ht); ++std::get<0>(ht)) {
                sum_a_pi += pi[std::get<0>(ht)->row];
                sum_a_p += P[std::get<0>(ht)->value];
            }

            R[r_size].id = r_size;
            R[r_size].value = c(begin->column, x) - sum_a_pi - sum_a_p;

            ++r_size;
        }

        return r_size;
    }